

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::ContainerPrinter::PrintValue<phmap::priv::BitMask<unsigned_int,16,0>,void>
               (BitMask<unsigned_int,_16,_0> *container,ostream *os)

{
  bool bVar1;
  uint32_t local_44;
  uint32_t *local_40;
  uint32_t *elem;
  BitMask<unsigned_int,_16,_0> __end0;
  BitMask<unsigned_int,_16,_0> __begin0;
  BitMask<unsigned_int,_16,_0> *__range3;
  size_t count;
  size_t kMaxCount;
  ostream *os_local;
  BitMask<unsigned_int,_16,_0> *container_local;
  
  std::operator<<(os,'{');
  __range3 = (BitMask<unsigned_int,_16,_0> *)0x0;
  ___end0 = container;
  elem._4_4_ = phmap::priv::BitMask<unsigned_int,_16,_0>::begin(container);
  elem._0_4_ = phmap::priv::BitMask<unsigned_int,_16,_0>::end(___end0);
  do {
    bVar1 = phmap::priv::operator!=
                      ((BitMask<unsigned_int,_16,_0> *)((long)&elem + 4),
                       (BitMask<unsigned_int,_16,_0> *)&elem);
    if (!bVar1) {
LAB_00187b4a:
      if (__range3 != (BitMask<unsigned_int,_16,_0> *)0x0) {
        std::operator<<(os,' ');
      }
      std::operator<<(os,'}');
      return;
    }
    local_44 = phmap::priv::BitMask<unsigned_int,_16,_0>::operator*
                         ((BitMask<unsigned_int,_16,_0> *)((long)&elem + 4));
    local_40 = &local_44;
    if ((__range3 != (BitMask<unsigned_int,_16,_0> *)0x0) &&
       (std::operator<<(os,','), __range3 == (BitMask<unsigned_int,_16,_0> *)0x20)) {
      std::operator<<(os," ...");
      goto LAB_00187b4a;
    }
    std::operator<<(os,' ');
    UniversalPrint<unsigned_int>(local_40,os);
    __range3 = (BitMask<unsigned_int,_16,_0> *)((long)&__range3->mask_ + 1);
    phmap::priv::BitMask<unsigned_int,_16,_0>::operator++
              ((BitMask<unsigned_int,_16,_0> *)((long)&elem + 4));
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }